

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

void __thiscall CVmFormatter::flush(CVmFormatter *this,vm_nl_type nl)

{
  int iVar1;
  size_t sVar2;
  uint in_ESI;
  long *in_RDI;
  bool bVar3;
  size_t movecnt;
  vm_nl_type write_nl;
  int cnt;
  vm_nl_type in_stack_00000084;
  vmcon_color_t *in_stack_00000088;
  size_t in_stack_00000090;
  wchar_t *in_stack_00000098;
  CVmFormatter *in_stack_000000a0;
  CVmFormatter *in_stack_ffffffffffffffe0;
  int local_10;
  
  *(undefined4 *)((long)in_RDI + (long)(int)in_RDI[3] * 4 + 0x28) = 0;
  expand_pending_tab(in_stack_ffffffffffffffe0,(int)((ulong)in_RDI >> 0x20));
  sVar2 = wcslen((wchar_t *)(in_RDI + 5));
  local_10 = (int)sVar2;
  if ((in_ESI != 1) && (in_ESI != 4)) {
    while( true ) {
      bVar3 = false;
      if (0 < local_10) {
        bVar3 = *(int *)((long)in_RDI + (long)(local_10 + -1) * 4 + 0x28) == 0x20;
      }
      if ((!bVar3) || ((*(byte *)((long)in_RDI + (long)(local_10 + -1) + 0xe048) & 1) != 0)) break;
      local_10 = local_10 + -1;
    }
    if (in_ESI == 2) {
      *(int *)(in_RDI + 3) = local_10;
    }
  }
  switch(in_ESI) {
  case 0:
  case 4:
    break;
  case 1:
    *(undefined4 *)(in_RDI + 0x1df1) = 0;
    break;
  case 2:
    break;
  case 3:
  }
  if ((local_10 != 0) ||
     (((*(int *)((long)in_RDI + 0x1c) != 0 && ((*(ushort *)((long)in_RDI + 0xef81) >> 5 & 1) == 0))
      || (0 < *(int *)((long)in_RDI + 0xefe4))))) {
    write_text(in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088,
               in_stack_00000084);
  }
  if (in_ESI < 2) {
    (**(code **)(*in_RDI + 0x48))();
    *(uint *)(in_RDI + 4) = (uint)(*(int *)((long)in_RDI + 0x1c) != 0);
  }
  else if (in_ESI == 4) {
    *(uint *)(in_RDI + 4) = (uint)(*(int *)((long)in_RDI + 0x1c) != 0);
  }
  else {
    *(undefined4 *)((long)in_RDI + 0x1c) = 0;
    *(undefined4 *)(in_RDI + 4) = 0;
  }
  if (local_10 < (int)in_RDI[3]) {
    sVar2 = (size_t)((int)in_RDI[3] - local_10);
    memmove(in_RDI + 5,(void *)((long)in_RDI + (long)local_10 * 4 + 0x28),sVar2 << 2);
    memmove(in_RDI + 0x406,in_RDI + (long)local_10 * 3 + 0x406,sVar2 * 0x18);
    memmove(in_RDI + 0x1c09,(void *)((long)in_RDI + (long)local_10 + 0xe048),sVar2);
  }
  *(int *)(in_RDI + 3) = (int)in_RDI[3] - local_10;
  if (in_ESI == 2) {
    *(ushort *)((long)in_RDI + 0xef81) = *(ushort *)((long)in_RDI + 0xef81) & 0xffdf | 0x20;
  }
  else if (local_10 != 0) {
    *(ushort *)((long)in_RDI + 0xef81) = *(ushort *)((long)in_RDI + 0xef81) & 0xffdf;
  }
  iVar1 = vmcon_color_t::equals
                    ((vmcon_color_t *)(in_RDI + 0x1d9e),(vmcon_color_t *)(in_RDI + 0x1da1));
  if (iVar1 == 0) {
    if ((int)in_RDI[0x1da0] != (int)in_RDI[0x1da3]) {
      (**(code **)(*in_RDI + 0x38))(in_RDI,(int)in_RDI[0x1da0]);
    }
    if ((in_RDI[0x1d9e] != in_RDI[0x1da1]) || (in_RDI[0x1d9f] != in_RDI[0x1da2])) {
      (**(code **)(*in_RDI + 0x28))(in_RDI,in_RDI[0x1d9e],in_RDI[0x1d9f]);
    }
    in_RDI[0x1da1] = in_RDI[0x1d9e];
    in_RDI[0x1da2] = in_RDI[0x1d9f];
    in_RDI[0x1da3] = in_RDI[0x1da0];
  }
  return;
}

Assistant:

void CVmFormatter::flush(VMG_ vm_nl_type nl)
{
    int cnt;
    vm_nl_type write_nl;

    /* null-terminate the current output line buffer */
    linebuf_[linepos_] = '\0';

    /* 
     *   Expand any pending tab.  Allow "anonymous" tabs only if we're
     *   flushing because we're ending the line normally; if we're not
     *   ending the line, we can't handle tabs that depend on the line
     *   ending. 
     */
    expand_pending_tab(vmg_ nl == VM_NL_NEWLINE);

    /* 
     *   note number of characters to display - assume we'll display all of
     *   the characters in the buffer 
     */
    cnt = wcslen(linebuf_);

    /* 
     *   Trim trailing spaces, unless we're about to read input or are doing
     *   an internal flush.  (Show trailing spaces when reading input, since
     *   we won't be able to revise the layout after this point.  Don't trim
     *   on an internal flush either, as this kind of flushing simply empties
     *   out our buffer exactly as it is.)  
     */
    if (nl != VM_NL_INPUT && nl != VM_NL_NONE_INTERNAL)
    {
        /* 
         *   look for last non-space character, but keep any spaces that come
         *   before an explicit non-breaking flag 
         */
        for ( ; cnt > 0 && linebuf_[cnt-1] == ' ' ; --cnt)
        {
            /* don't remove this character if it's marked as non-breaking */
            if ((flagbuf_[cnt-1] & VMCON_OBF_NOBREAK) != 0)
                break;
        }

        /* 
         *   if we're actually doing a newline, discard the trailing spaces
         *   for good - we don't want them at the start of the next line 
         */
        if (nl == VM_NL_NEWLINE)
            linepos_ = cnt;
    }

    /* check the newline mode */
    switch(nl)
    {
    case VM_NL_NONE:
    case VM_NL_NONE_INTERNAL:
        /* no newline - just flush out what we have */
        write_nl = VM_NL_NONE;
        break;

    case VM_NL_INPUT:
        /* no newline - flush out what we have */
        write_nl = VM_NL_NONE;

        /* on input, reset the HTML parsing state */
        html_passthru_state_ = VMCON_HPS_NORMAL;
        break;

    case VM_NL_NEWLINE:
        /* 
         *   We're adding a newline.  We want to suppress redundant
         *   newlines -- we reduce any run of consecutive vertical
         *   whitespace to a single newline.  So, if we have anything in
         *   this line, or we didn't already just write a newline, write
         *   out a newline now; otherwise, write nothing.  
         */
        if (linecol_ != 0 || !just_did_nl_ || html_pre_level_ > 0)
        {
            /* add the newline */
            write_nl = VM_NL_NEWLINE;
        }
        else
        {
            /* 
             *   Don't write out a newline after all - the line buffer is
             *   empty, and we just wrote a newline, so this is a
             *   redundant newline that we wish to suppress (so that we
             *   collapse a run of vertical whitespace down to a single
             *   newline).  
             */
            write_nl = VM_NL_NONE;
        }
        break;

    case VM_NL_OSNEWLINE:
        /* 
         *   we're going to depend on the underlying OS output layer to do
         *   line breaking, so we won't add a newline, but we will add a
         *   space, so that the underlying OS layer knows we have a word
         *   break here 
         */
        write_nl = VM_NL_OSNEWLINE;
        break;
    }

    /* 
     *   display the line, as long as we have something buffered to
     *   display; even if we don't, display it if our column is non-zero
     *   and we didn't just do a newline, since this must mean that we've
     *   flushed a partial line and are just now doing the newline 
     */
    if (cnt != 0 || (linecol_ != 0 && !just_did_nl_)
        || html_pre_level_ > 0)
    {
        /* write it out */
        write_text(vmg_ linebuf_, cnt, colorbuf_, write_nl);
    }

    /* check the line ending */
    switch (nl)
    {
    case VM_NL_NONE:
    case VM_NL_INPUT:
        /* we're not displaying a newline, so flush what we have */
        flush_to_os();

        /* 
         *   the subsequent buffer will be a continuation of the current
         *   text, if we've displayed anything at all here 
         */
        is_continuation_ = (linecol_ != 0);
        break;

    case VM_NL_NONE_INTERNAL:
        /* 
         *   internal buffer flush only - subsequent text will be a
         *   continuation of the current line, if there's anything on the
         *   current line 
         */
        is_continuation_ = (linecol_ != 0);
        break;

    default:
        /* we displayed a newline, so reset the column position */
        linecol_ = 0;

        /* the next buffer starts a new line on the display */
        is_continuation_ = FALSE;
        break;
    }

    /* 
     *   Move any trailing characters we didn't write in this go to the start
     *   of the buffer.  
     */
    if (cnt < linepos_)
    {
        size_t movecnt;

        /* calculate how many trailing characters we didn't write */
        movecnt = linepos_ - cnt;

        /* move the characters, colors, and flags */
        memmove(linebuf_, linebuf_ + cnt, movecnt * sizeof(linebuf_[0]));
        memmove(colorbuf_, colorbuf_ + cnt, movecnt * sizeof(colorbuf_[0]));
        memmove(flagbuf_, flagbuf_ + cnt, movecnt * sizeof(flagbuf_[0]));
    }

    /* move the line output position to follow the preserved characters */
    linepos_ -= cnt;

    /* 
     *   If we just output a newline, note it.  If we didn't just output a
     *   newline, but we did write out anything else, note that we're no
     *   longer at the start of a line on the underlying output device.  
     */
    if (nl == VM_NL_NEWLINE)
        just_did_nl_ = TRUE;
    else if (cnt != 0)
        just_did_nl_ = FALSE;

    /* 
     *   if the current buffering color doesn't match the current osifc-layer
     *   color, then we must need to flush just the new color/attribute
     *   settings (this can happen when we have changed the attributes in
     *   preparation for reading input, since we won't have any actual text
     *   to write after the color change) 
     */
    if (!cur_color_.equals(&os_color_))
    {
        /* set the text attributes in the OS window, if they changed */
        if (cur_color_.attr != os_color_.attr)
            set_os_text_attr(cur_color_.attr);

        /* set the color in the OS window, if it changed */
        if (cur_color_.fg != os_color_.fg
            || cur_color_.bg != os_color_.bg)
            set_os_text_color(cur_color_.fg, cur_color_.bg);

        /* set the new osifc color */
        os_color_ = cur_color_;
    }
}